

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O0

Dims * adios2::utils::get_global_array_signature<long>(Engine *fp,IO *io,Variable<long> *variable)

{
  long lVar1;
  long *plVar2;
  bool bVar3;
  undefined8 uVar4;
  reference pvVar5;
  pointer ppVar6;
  long in_RCX;
  long *in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  size_t k_1;
  Dims d;
  size_t absstep;
  size_t step_1;
  const_iterator itStep;
  map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *indices;
  size_t n;
  size_t k;
  size_t step;
  MinVarInfo *minBlocks;
  bool firstStep;
  size_t nsteps;
  size_t ndim;
  Dims *dims;
  map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *in_stack_fffffffffffffe98;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_stack_fffffffffffffea0;
  allocator_type *in_stack_fffffffffffffea8;
  value_type vVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffeb0;
  void *pvVar8;
  size_type in_stack_fffffffffffffeb8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffec0;
  size_type local_e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d8;
  unsigned_long local_c0;
  ulong local_b8;
  _Self local_b0;
  _Self local_a8;
  long local_a0;
  value_type local_98;
  ulong local_90;
  ulong local_88;
  void *local_80;
  byte local_71;
  ulong local_70;
  undefined1 local_68 [48];
  undefined8 local_38;
  undefined1 local_29;
  size_type local_28;
  long local_20;
  long *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_28 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RCX + 0x58));
  local_29 = 0;
  local_38 = 0;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x18c1b0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
             (value_type_conflict1 *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x18c1db);
  if ((timestep & 1) == 0) {
    local_70 = adios2::core::VariableBase::GetAvailableStepsCount();
    plVar2 = local_10;
    lVar1 = local_20;
    local_71 = 1;
    uVar4 = (**(code **)(*local_10 + 0x20))();
    local_80 = (void *)(**(code **)(*plVar2 + 0x58))(plVar2,lVar1,uVar4);
    if (local_80 == (void *)0x0) {
      local_a0 = local_20 + 0x158;
      local_a8._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ::begin(in_stack_fffffffffffffe98);
      local_b0._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ::end(in_stack_fffffffffffffe98);
      bVar3 = std::operator!=(&local_a8,&local_b0);
      if (bVar3) {
        for (local_b8 = 0; local_b8 < local_70; local_b8 = local_b8 + 1) {
          ppVar6 = std::
                   _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator->(in_stack_fffffffffffffea0);
          local_c0 = ppVar6->first;
          adios2::core::VariableBase::Shape((ulong)&local_d8);
          bVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                            (in_stack_fffffffffffffeb0);
          if (!bVar3) {
            for (local_e8 = 0; local_e8 < local_28; local_e8 = local_e8 + 1) {
              if ((local_71 & 1) == 0) {
                pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (in_RDI,local_e8);
                in_stack_fffffffffffffea0 =
                     (_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      *)*pvVar5;
                pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (&local_d8,local_e8);
                if (in_stack_fffffffffffffea0 !=
                    (_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     *)*pvVar5) {
                  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                     (in_RDI,local_e8);
                  *pvVar5 = 0;
                }
              }
              else {
                pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (&local_d8,local_e8);
                vVar7 = *pvVar5;
                pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (in_RDI,local_e8);
                *pvVar5 = vVar7;
              }
            }
            local_71 = 0;
            std::
            _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::operator++(in_stack_fffffffffffffea0);
          }
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                    (in_stack_fffffffffffffeb0);
        }
      }
    }
    else {
      for (local_88 = 0; local_88 < local_70; local_88 = local_88 + 1) {
        if (local_88 != 0) {
          local_80 = (void *)(**(code **)(*local_10 + 0x58))(local_10,local_20,local_88);
        }
        if (*(long *)((long)local_80 + 0x10) != 0) {
          for (local_90 = 0; local_90 < local_28; local_90 = local_90 + 1) {
            if ((*(byte *)((long)local_80 + 8) & 1) == 0) {
              vVar7 = *(value_type *)(*(long *)((long)local_80 + 0x10) + local_90 * 8);
            }
            else {
              vVar7 = *(value_type *)((long)local_80 + 0x10);
            }
            local_98 = vVar7;
            if ((local_71 & 1) == 0) {
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (in_RDI,local_90);
              if (*pvVar5 != local_98) {
                pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (in_RDI,local_90);
                *pvVar5 = 0;
              }
            }
            else {
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (in_RDI,local_90);
              *pvVar5 = vVar7;
            }
          }
          local_71 = 0;
        }
        if (local_80 != (void *)0x0) {
          pvVar8 = local_80;
          MinVarInfo::~MinVarInfo((MinVarInfo *)0x18c490);
          operator_delete(pvVar8);
        }
      }
    }
  }
  else {
    adios2::core::VariableBase::Shape((ulong)local_68);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (in_stack_fffffffffffffeb0,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffea8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_fffffffffffffeb0);
  }
  return in_RDI;
}

Assistant:

Dims get_global_array_signature(core::Engine *fp, core::IO *io, core::Variable<T> *variable)
{
    const size_t ndim = variable->m_Shape.size();
    Dims dims(ndim, 0);
    if (timestep)
    {
        dims = variable->Shape();
    }
    else
    {
        const size_t nsteps = variable->GetAvailableStepsCount();
        bool firstStep = true;

        // looping over the absolute step indexes
        // is not supported by a simple API function
        auto minBlocks = fp->MinBlocksInfo(*variable, fp->CurrentStep());

        if (minBlocks)
        {
            for (size_t step = 0; step < nsteps; step++)
            {
                if (step > 0)
                {
                    minBlocks = fp->MinBlocksInfo(*variable, step);
                }
                if (minBlocks->Shape)
                {
                    for (size_t k = 0; k < ndim; k++)
                    {
                        size_t n =
                            (minBlocks->WasLocalValue ? reinterpret_cast<size_t>(minBlocks->Shape)
                                                      : minBlocks->Shape[k]);
                        if (firstStep)
                        {
                            dims[k] = n;
                        }
                        else if (dims[k] != n)
                        {
                            dims[k] = 0;
                        }
                    }
                    firstStep = false;
                }
                delete minBlocks;
            }
        }
        else
        {
            const std::map<size_t, std::vector<size_t>> &indices =
                variable->m_AvailableStepBlockIndexOffsets;
            auto itStep = indices.begin();
            if (itStep != indices.end())
            {
                for (size_t step = 0; step < nsteps; step++)
                {
                    const size_t absstep = itStep->first;
                    Dims d = variable->Shape(absstep - 1);
                    if (d.empty())
                    {
                        continue;
                    }

                    for (size_t k = 0; k < ndim; k++)
                    {
                        if (firstStep)
                        {
                            dims[k] = d[k];
                        }
                        else if (dims[k] != d[k])
                        {
                            dims[k] = 0;
                        }
                    }
                    firstStep = false;
                    ++itStep;
                }
            }
        }
    }
    return dims;
}